

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O2

void __thiscall
EfcFlash::EfcFlash(EfcFlash *this,Samba *samba,string *name,uint32_t addr,uint32_t pages,
                  uint32_t size,uint32_t planes,uint32_t lockRegions,uint32_t user,uint32_t stack,
                  bool canBootFlash)

{
  char *__assertion;
  uint __line;
  
  Flash::Flash(&this->super_Flash,samba,name,addr,pages,size,planes,lockRegions,user,stack);
  (this->super_Flash)._vptr_Flash = (_func_int **)&PTR__EfcFlash_00117a80;
  (this->super_Flash).field_0xf4 = canBootFlash;
  if (planes - 1 < 2) {
    if (planes << 10 < pages) {
      __assertion = "pages <= planes * 1024";
      __line = 0x44;
    }
    else {
      if (lockRegions < 0x21) {
        eraseAuto(this,true);
        return;
      }
      __assertion = "lockRegions <= 32";
      __line = 0x45;
    }
  }
  else {
    __assertion = "planes == 1 || planes == 2";
    __line = 0x43;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/EfcFlash.cpp"
                ,__line,
                "EfcFlash::EfcFlash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool)"
               );
}

Assistant:

EfcFlash::EfcFlash(Samba& samba,
                   const std::string& name,
                   uint32_t addr,
                   uint32_t pages,
                   uint32_t size,
                   uint32_t planes,
                   uint32_t lockRegions,
                   uint32_t user,
                   uint32_t stack,
                   bool canBootFlash)
    : Flash(samba, name, addr, pages, size, planes, lockRegions, user, stack),
      _canBootFlash(canBootFlash)
{
    assert(planes == 1 || planes == 2);
    assert(pages <= planes * 1024);
    assert(lockRegions <= 32);

    eraseAuto(true);
}